

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.cpp
# Opt level: O0

ostream * operator<<(ostream *os,ChainstateRole *role)

{
  int iVar1;
  long lVar2;
  int *in_RSI;
  ostream *in_RDI;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = *in_RSI;
  if (iVar1 == 0) {
    std::operator<<(in_RDI,"normal");
  }
  else if (iVar1 == 1) {
    std::operator<<(in_RDI,"background");
  }
  else if (iVar1 == 2) {
    std::operator<<(in_RDI,"assumedvalid");
  }
  else {
    std::ios::setstate((int)in_RDI + (int)*(undefined8 *)(*(long *)in_RDI + -0x18));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

std::ostream& operator<<(std::ostream& os, const ChainstateRole& role) {
    switch(role) {
        case ChainstateRole::NORMAL: os << "normal"; break;
        case ChainstateRole::ASSUMEDVALID: os << "assumedvalid"; break;
        case ChainstateRole::BACKGROUND: os << "background"; break;
        default: os.setstate(std::ios_base::failbit);
    }
    return os;
}